

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O3

aiMatrix4x4 * get_world_transform(aiMatrix4x4 *__return_storage_ptr__,aiNode *node,aiScene *scene)

{
  __normal_iterator<const_aiNode_**,_std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>_>
  __tmp;
  iterator iVar1;
  vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> node_chain;
  aiNode *local_40;
  aiNode **local_38;
  iterator iStack_30;
  aiNode **local_28;
  
  local_38 = (aiNode **)0x0;
  iStack_30._M_current = (aiNode **)0x0;
  local_28 = (aiNode **)0x0;
  local_40 = node;
  if (scene->mRootNode != node) {
    do {
      if (iStack_30._M_current == local_28) {
        std::vector<aiNode_const*,std::allocator<aiNode_const*>>::
        _M_realloc_insert<aiNode_const*const&>
                  ((vector<aiNode_const*,std::allocator<aiNode_const*>> *)&local_38,iStack_30,
                   &local_40);
      }
      else {
        *iStack_30._M_current = local_40;
        iStack_30._M_current = iStack_30._M_current + 1;
      }
      local_40 = local_40->mParent;
    } while (local_40 != scene->mRootNode);
  }
  __return_storage_ptr__->a1 = 1.0;
  __return_storage_ptr__->a2 = 0.0;
  __return_storage_ptr__->a3 = 0.0;
  __return_storage_ptr__->a4 = 0.0;
  __return_storage_ptr__->b1 = 0.0;
  __return_storage_ptr__->b2 = 1.0;
  __return_storage_ptr__->b3 = 0.0;
  __return_storage_ptr__->b4 = 0.0;
  __return_storage_ptr__->c1 = 0.0;
  __return_storage_ptr__->c2 = 0.0;
  __return_storage_ptr__->c3 = 1.0;
  __return_storage_ptr__->c4 = 0.0;
  __return_storage_ptr__->d1 = 0.0;
  __return_storage_ptr__->d2 = 0.0;
  __return_storage_ptr__->d3 = 0.0;
  __return_storage_ptr__->d4 = 1.0;
  for (iVar1._M_current = iStack_30._M_current; iVar1._M_current != local_38;
      iVar1._M_current = iVar1._M_current + -1) {
    aiMatrix4x4t<float>::operator*=(__return_storage_ptr__,&iVar1._M_current[-1]->mTransformation);
  }
  if (iVar1._M_current != (aiNode **)0x0) {
    operator_delete(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 get_world_transform(const aiNode* node, const aiScene* scene)
{
    std::vector<const aiNode*> node_chain;
    while (node != scene->mRootNode) {
        node_chain.push_back(node);
        node = node->mParent;
    }
    aiMatrix4x4 transform;
    for (auto n = node_chain.rbegin(); n != node_chain.rend(); ++n) {
        transform *= (*n)->mTransformation;
    }
    return transform;
}